

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O0

void __thiscall
btBU_Simplex1to4::btBU_Simplex1to4
          (btBU_Simplex1to4 *this,btVector3 *pt0,btVector3 *pt1,btVector3 *pt2,btVector3 *pt3)

{
  btVector3 *pbVar1;
  btBU_Simplex1to4 *pbVar2;
  btBU_Simplex1to4 *in_RDI;
  btVector3 *local_40;
  btPolyhedralConvexAabbCachingShape *in_stack_ffffffffffffffd0;
  
  btPolyhedralConvexAabbCachingShape::btPolyhedralConvexAabbCachingShape(in_stack_ffffffffffffffd0);
  (in_RDI->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
  super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btBU_Simplex1to4_002e5a40;
  *(undefined4 *)&(in_RDI->super_btPolyhedralConvexAabbCachingShape).field_0x74 = 0;
  pbVar2 = in_RDI + 1;
  pbVar1 = in_RDI->m_vertices;
  do {
    local_40 = pbVar1;
    btVector3::btVector3(local_40);
    pbVar1 = (btVector3 *)(local_40->m_floats + 4);
  } while ((btBU_Simplex1to4 *)(local_40->m_floats + 4) != pbVar2);
  (in_RDI->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
  super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_shapeType = 2;
  addVertex(in_RDI,local_40);
  addVertex(in_RDI,local_40);
  addVertex(in_RDI,local_40);
  addVertex(in_RDI,local_40);
  return;
}

Assistant:

btBU_Simplex1to4::btBU_Simplex1to4(const btVector3& pt0,const btVector3& pt1,const btVector3& pt2,const btVector3& pt3) : btPolyhedralConvexAabbCachingShape (),
m_numVertices(0)
{
	m_shapeType = TETRAHEDRAL_SHAPE_PROXYTYPE;
	addVertex(pt0);
	addVertex(pt1);
	addVertex(pt2);
	addVertex(pt3);
}